

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

bool __thiscall tchecker::clockbounds::df_solver_t::ensure_tight(df_solver_t *this)

{
  bool bVar1;
  status_t sVar2;
  
  bVar1 = tchecker::dbm::is_empty_0(this->_L,(clock_id_t)this->_dim);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = tchecker::dbm::is_empty_0(this->_U,(clock_id_t)this->_dim);
    bVar1 = !bVar1;
  }
  if (this->_updated_L == true) {
    sVar2 = tchecker::dbm::tighten(this->_L,(clock_id_t)this->_dim);
    bVar1 = (bool)(bVar1 & sVar2 != EMPTY);
  }
  if (this->_updated_U == true) {
    sVar2 = tchecker::dbm::tighten(this->_U,(clock_id_t)this->_dim);
    bVar1 = (bool)(bVar1 & sVar2 != EMPTY);
  }
  this->_updated_L = false;
  this->_updated_U = false;
  return bVar1;
}

Assistant:

bool df_solver_t::ensure_tight()
{
  bool consistent = !tchecker::dbm::is_empty_0(_L, _dim) && !tchecker::dbm::is_empty_0(_U, _dim);

  if (_updated_L)
    consistent &= (tchecker::dbm::tighten(_L, _dim) != tchecker::dbm::EMPTY);
  if (_updated_U)
    consistent &= (tchecker::dbm::tighten(_U, _dim) != tchecker::dbm::EMPTY);

  _updated_L = false;
  _updated_U = false;

  return consistent;
}